

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

bcf_hdr_t * bcf_hdr_read(htsFile *hfp)

{
  int iVar1;
  ssize_t sVar2;
  char *htxt_00;
  char *htxt;
  bcf_hdr_t *pbStack_30;
  int hlen;
  bcf_hdr_t *h;
  BGZF *pBStack_20;
  uint8_t magic [5];
  BGZF *fp;
  htsFile *hfp_local;
  
  if ((hfp->format).format == vcf) {
    hfp_local = (htsFile *)vcf_hdr_read(hfp);
  }
  else {
    pBStack_20 = (hfp->fp).bgzf;
    pbStack_30 = bcf_hdr_init("r");
    sVar2 = bgzf_read(pBStack_20,(void *)((long)&h + 3),5);
    if (sVar2 < 0) {
      fprintf(_stderr,"[%s:%d %s] Failed to read the header (reading BCF in text mode?)\n",
              "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
              ,0x2f1,"bcf_hdr_read");
      hfp_local = (htsFile *)0x0;
    }
    else {
      iVar1 = strncmp((char *)((long)&h + 3),"BCF\x02\x02",5);
      if (iVar1 == 0) {
        bgzf_read(pBStack_20,(void *)((long)&htxt + 4),4);
        htxt_00 = (char *)malloc((long)htxt._4_4_);
        bgzf_read(pBStack_20,htxt_00,(long)htxt._4_4_);
        bcf_hdr_parse(pbStack_30,htxt_00);
        free(htxt_00);
        hfp_local = (htsFile *)pbStack_30;
      }
      else {
        iVar1 = strncmp((char *)((long)&h + 3),"BCF",3);
        if (iVar1 == 0) {
          fprintf(_stderr,"[%s:%d %s] invalid BCF2 magic string: only BCFv2.2 is supported.\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                  ,0x2f7,"bcf_hdr_read");
        }
        else if (1 < hts_verbose) {
          fprintf(_stderr,"[E::%s] invalid BCF2 magic string\n","bcf_hdr_read");
        }
        bcf_hdr_destroy(pbStack_30);
        hfp_local = (htsFile *)0x0;
      }
    }
  }
  return (bcf_hdr_t *)hfp_local;
}

Assistant:

bcf_hdr_t *bcf_hdr_read(htsFile *hfp)
{
    if (hfp->format.format == vcf)
        return vcf_hdr_read(hfp);

    BGZF *fp = hfp->fp.bgzf;
    uint8_t magic[5];
    bcf_hdr_t *h;
    h = bcf_hdr_init("r");
    if ( bgzf_read(fp, magic, 5)<0 )
    {
        fprintf(stderr,"[%s:%d %s] Failed to read the header (reading BCF in text mode?)\n", __FILE__,__LINE__,__FUNCTION__);
        return NULL;
    }
    if (strncmp((char*)magic, "BCF\2\2", 5) != 0)
    {
        if (!strncmp((char*)magic, "BCF", 3))
            fprintf(stderr,"[%s:%d %s] invalid BCF2 magic string: only BCFv2.2 is supported.\n", __FILE__,__LINE__,__FUNCTION__);
        else if (hts_verbose >= 2)
            fprintf(stderr, "[E::%s] invalid BCF2 magic string\n", __func__);
        bcf_hdr_destroy(h);
        return 0;
    }
    int hlen;
    char *htxt;
    bgzf_read(fp, &hlen, 4);
    htxt = (char*)malloc(hlen);
    bgzf_read(fp, htxt, hlen);
    bcf_hdr_parse(h, htxt);
    free(htxt);
    return h;
}